

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

PoolingLayerParams * __thiscall
CoreML::Specification::PoolingLayerParams::New(PoolingLayerParams *this,Arena *arena)

{
  PoolingLayerParams *this_00;
  PoolingLayerParams *n;
  Arena *arena_local;
  PoolingLayerParams *this_local;
  
  this_00 = (PoolingLayerParams *)operator_new(0x58);
  PoolingLayerParams(this_00);
  if (arena != (Arena *)0x0) {
    google::protobuf::Arena::Own<CoreML::Specification::PoolingLayerParams>(arena,this_00);
  }
  return this_00;
}

Assistant:

PoolingLayerParams* PoolingLayerParams::New(::google::protobuf::Arena* arena) const {
  PoolingLayerParams* n = new PoolingLayerParams;
  if (arena != NULL) {
    arena->Own(n);
  }
  return n;
}